

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_base_gettimeofday_cached(event_base *base,timeval *tv)

{
  int local_24;
  int r;
  timeval *tv_local;
  event_base *base_local;
  
  tv_local = (timeval *)base;
  if ((base == (event_base *)0x0) &&
     (tv_local = (timeval *)event_global_current_base_,
     event_global_current_base_ == (event_base *)0x0)) {
    base_local._4_4_ = gettimeofday((timeval *)tv,(__timezone_ptr_t)0x0);
  }
  else {
    if (tv_local[0x1b].tv_sec != 0) {
      (*evthread_lock_fns_.lock)(0,(void *)tv_local[0x1b].tv_sec);
    }
    if (tv_local[0x15].tv_usec == 0) {
      local_24 = gettimeofday((timeval *)tv,(__timezone_ptr_t)0x0);
    }
    else {
      tv->tv_sec = tv_local[0x15].tv_usec + tv_local[0x19].tv_sec;
      tv->tv_usec = tv_local[0x16].tv_sec + tv_local[0x19].tv_usec;
      if (999999 < tv->tv_usec) {
        tv->tv_sec = tv->tv_sec + 1;
        tv->tv_usec = tv->tv_usec + -1000000;
      }
      local_24 = 0;
    }
    if (tv_local[0x1b].tv_sec != 0) {
      (*evthread_lock_fns_.unlock)(0,(void *)tv_local[0x1b].tv_sec);
    }
    base_local._4_4_ = local_24;
  }
  return base_local._4_4_;
}

Assistant:

int
event_base_gettimeofday_cached(struct event_base *base, struct timeval *tv)
{
	int r;
	if (!base) {
		base = current_base;
		if (!current_base)
			return evutil_gettimeofday(tv, NULL);
	}

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (base->tv_cache.tv_sec == 0) {
		r = evutil_gettimeofday(tv, NULL);
	} else {
		evutil_timeradd(&base->tv_cache, &base->tv_clock_diff, tv);
		r = 0;
	}
	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return r;
}